

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
ptc::Print<char>::print_backend<std::__cxx11::ostringstream&,char_const(&)[1]>
          (Print<char> *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os,
          char (*first) [1])

{
  size_type sVar1;
  bool bVar2;
  ANSI in_EAX;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 local_28;
  
  local_28._0_4_ = in_EAX;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)mutex_);
  if (iVar3 == 0) {
    local_28 = (ulong)(ANSI)local_28;
    bVar2 = is_escape<char[1]>(first,(ANSI *)((long)&local_28 + 4));
    if ((bVar2) || (sVar1 = (this->pattern)._M_string_length, sVar1 == 0)) {
      sVar5 = strlen(*first);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,*first,sVar5);
    }
    else {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(this->pattern)._M_dataplus._M_p,sVar1);
      sVar5 = strlen(*first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,*first,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,(this->end)._M_dataplus._M_p,(this->end)._M_string_length);
    local_28 = CONCAT44(local_28._4_4_,1);
    bVar2 = is_escape<char[1]>(first,(ANSI *)&local_28);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"\x1b[0m",4);
    }
    if (this->flush == true) {
      std::ostream::flush();
    }
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    return;
  }
  uVar6 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  _Unwind_Resume(uVar6);
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }